

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O1

bool dxil_spv::emit_select_instruction(Impl *impl,SelectInst *instruction)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  ValueKind VVar4;
  Predicate PVar5;
  Id arg;
  BinaryOps BVar6;
  Value *pVVar7;
  Value *value;
  Value *value_00;
  CmpInst *this;
  Instruction *this_00;
  LoggingCallback p_Var8;
  Constant *this_01;
  APInt *this_02;
  int64_t iVar9;
  Operation *this_03;
  Type *pTVar10;
  BinaryOperator *this_04;
  Instruction *pIVar11;
  void *pvVar12;
  uint i;
  uint uVar13;
  Constant *this_05;
  CmpInst *this_06;
  BinaryOperator *this_07;
  uint32_t const_val;
  uint32_t const_val_1;
  uint32_t local_103c;
  ulong local_1038;
  undefined5 uStack_1030;
  undefined3 uStack_102b;
  undefined5 uStack_1028;
  char acStack_1023 [4083];
  
  pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  value_00 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  this_06 = (CmpInst *)0x0;
  if (pVVar7 != (Value *)0x0) {
    this = (CmpInst *)LLVMBC::Internal::resolve_proxy(pVVar7);
    VVar4 = LLVMBC::Value::get_value_kind((Value *)this);
    bVar2 = LLVMBC::CmpInst::is_base_of_value_kind(VVar4);
    this_06 = (CmpInst *)0x0;
    if (bVar2) {
      this_06 = this;
    }
  }
  if ((this_06 == (CmpInst *)0x0) ||
     (PVar5 = LLVMBC::CmpInst::getPredicate(this_06), PVar5 != ICMP_EQ)) {
    bVar2 = false;
  }
  else {
    pVVar7 = LLVMBC::Instruction::getOperand(&this_06->super_Instruction,0);
    bVar2 = value_is_dx_op_instrinsic(pVVar7,FirstbitHi);
    if (!bVar2) {
      bVar2 = false;
      pVVar7 = LLVMBC::Instruction::getOperand(&this_06->super_Instruction,0);
      bVar3 = value_is_dx_op_instrinsic(pVVar7,FirstbitSHi);
      if (!bVar3) goto LAB_00157f95;
    }
    local_103c = 0;
    bVar3 = get_constant_operand(&this_06->super_Instruction,1,&local_103c);
    bVar2 = local_103c == 0xffffffff && bVar3;
    if (local_103c == 0xffffffff && bVar3) {
      pVVar7 = LLVMBC::Instruction::getOperand(&this_06->super_Instruction,0);
      this_00 = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar7);
      VVar4 = LLVMBC::Value::get_value_kind((Value *)this_00);
      if (VVar4 != Call) {
        p_Var8 = get_thread_log_callback();
        if (p_Var8 == (LoggingCallback)0x0) {
          emit_select_instruction();
          std::terminate();
        }
        uStack_1028 = 0x6163206e69;
        builtin_strncpy(acStack_1023,"st<T>.\n",8);
        local_1038._0_1_ = 'I';
        local_1038._1_1_ = 'n';
        local_1038._2_1_ = 'v';
        local_1038._3_1_ = 'a';
        local_1038._4_1_ = 'l';
        local_1038._5_1_ = 'i';
        local_1038._6_1_ = 'd';
        local_1038._7_1_ = ' ';
        uStack_1030 = 0x2065707974;
        uStack_102b = 0x204449;
        pvVar12 = get_thread_log_callback_userdata();
        (*p_Var8)(pvVar12,Error,(char *)&local_1038);
        std::terminate();
      }
      goto LAB_00157f98;
    }
  }
LAB_00157f95:
  this_00 = (Instruction *)0x0;
LAB_00157f98:
  if (bVar2) {
    if (value == (Value *)0x0) {
      this_05 = (Constant *)0x0;
    }
    else {
      this_01 = (Constant *)LLVMBC::Internal::resolve_proxy(value);
      VVar4 = LLVMBC::Value::get_value_kind((Value *)this_01);
      this_05 = (Constant *)0x0;
      if (VVar4 == ConstantInt) {
        this_05 = this_01;
      }
    }
    if (this_05 != (Constant *)0x0) {
      this_02 = LLVMBC::Constant::getUniqueInteger(this_05);
      iVar9 = LLVMBC::APInt::getSExtValue(this_02);
      if (iVar9 == -1) {
        if (value_00 == (Value *)0x0) {
          this_07 = (BinaryOperator *)0x0;
        }
        else {
          this_04 = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(value_00);
          VVar4 = LLVMBC::Value::get_value_kind((Value *)this_04);
          this_07 = (BinaryOperator *)0x0;
          if (VVar4 == BinaryOperator) {
            this_07 = this_04;
          }
        }
        if (((this_07 != (BinaryOperator *)0x0) &&
            (BVar6 = LLVMBC::BinaryOperator::getOpcode(this_07), BVar6 == Sub)) &&
           (pIVar11 = (Instruction *)LLVMBC::Instruction::getOperand(&this_07->super_Instruction,1),
           pIVar11 == this_00)) {
          local_1038 = local_1038 & 0xffffffff00000000;
          bVar2 = get_constant_operand(&this_07->super_Instruction,0,(uint32_t *)&local_1038);
          if (bVar2) {
            iVar1 = (int)local_1038;
            pVVar7 = LLVMBC::Instruction::getOperand(this_00,1);
            pTVar10 = LLVMBC::Value::getType(pVVar7);
            uVar13 = LLVMBC::Type::getIntegerBitWidth(pTVar10);
            if (iVar1 == uVar13 - 1) {
              bVar2 = value_is_dx_op_instrinsic(&this_00->super_Value,FirstbitHi);
              pVVar7 = LLVMBC::Instruction::getOperand(this_00,1);
              emit_native_bitscan(bVar2 | GLSLstd450FindSMsb,impl,&instruction->super_Instruction,
                                  pVVar7);
              return true;
            }
          }
        }
      }
    }
  }
  this_03 = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
  uVar13 = 0;
  do {
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar13);
    arg = Converter::Impl::get_id_for_value(impl,pVVar7,0);
    Operation::add_id(this_03,arg);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 3);
  Converter::Impl::add(impl,this_03,false);
  pTVar10 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar10,this_03->id,false);
  return true;
}

Assistant:

bool emit_select_instruction(Converter::Impl &impl, const llvm::SelectInst *instruction)
{
	if (emit_peephole_findmsb(impl, instruction))
		return true;

	Operation *op = impl.allocate(spv::OpSelect, instruction);

	for (unsigned i = 0; i < 3; i++)
		op->add_id(impl.get_id_for_value(instruction->getOperand(i)));

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}